

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

bool __thiscall QPDFObjectHandle::isPageObject(QPDFObjectHandle *this)

{
  QPDF *pQVar1;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  QPDFObjectHandle *local_18;
  QPDFObjectHandle *this_local;
  
  local_18 = this;
  pQVar1 = getOwningQPDF(this);
  if (pQVar1 == (QPDF *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    pQVar1 = getOwningQPDF(this);
    QPDF::getAllPages(pQVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"/Page",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
    this_local._7_1_ = isDictionaryOfType(this,&local_38,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
QPDFObjectHandle::isPageObject() const
{
    // See comments in QPDFObjectHandle.hh.
    if (getOwningQPDF() == nullptr) {
        return false;
    }
    // getAllPages repairs /Type when traversing the page tree.
    getOwningQPDF()->getAllPages();
    return isDictionaryOfType("/Page");
}